

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrmem.c
# Opt level: O2

int mem_create_comp(char *filename,int *handle)

{
  int iVar1;
  FILE *pFVar2;
  char mode [4];
  
  iVar1 = strcmp(filename,"-.gz");
  pFVar2 = _stdout;
  if (((iVar1 == 0) || (iVar1 = strcmp(filename,"stdout.gz"), pFVar2 = _stdout, iVar1 == 0)) ||
     (iVar1 = strcmp(filename,"STDOUT.gz"), pFVar2 = _stdout, iVar1 == 0)) {
LAB_00113214:
    iVar1 = mem_createmem(0xb40,handle);
    if (iVar1 == 0) {
      memTable[*handle].fileptr = (FILE *)pFVar2;
      iVar1 = 0;
    }
    else {
      ffpmsg("failed to create empty memory file (mem_create_comp)");
    }
  }
  else {
    builtin_strncpy(mode,"w+b",4);
    pFVar2 = fopen64(filename,"r");
    if (pFVar2 == (FILE *)0x0) {
      pFVar2 = fopen64(filename,mode);
      if (pFVar2 != (FILE *)0x0) goto LAB_00113214;
    }
    else {
      fclose(pFVar2);
    }
    iVar1 = 0x69;
  }
  return iVar1;
}

Assistant:

int mem_create_comp(char *filename, int *handle)
/*
  Create a new empty memory file for subsequent writes.
  Also create an empty compressed .gz file.  The memory file
  will be compressed and written to the disk file when the file is closed.
*/
{
    FILE *diskfile;
    char mode[4];
    int  status;

    /* first, create disk file for the compressed output */


    if ( !strcmp(filename, "-.gz") || !strcmp(filename, "stdout.gz") ||
         !strcmp(filename, "STDOUT.gz") )
    {
       /* special case: create uncompressed FITS file in memory, then
          compress it an write it out to 'stdout' when it is closed.  */

       diskfile = stdout;
    }
    else
    {
        /* normal case: create disk file for the compressed output */

        strcpy(mode, "w+b");    /* create file with read-write */

        diskfile = fopen(filename, "r"); /* does file already exist? */

        if (diskfile)
        {
            fclose(diskfile);         /* close file and exit with error */
            return(FILE_NOT_CREATED); 
        }

#if MACHINE == ALPHAVMS || MACHINE == VAXVMS
        /* specify VMS record structure: fixed format, 2880 byte records */
        /* but force stream mode access to enable random I/O access      */
        diskfile = fopen(filename, mode, "rfm=fix", "mrs=2880", "ctx=stm"); 
#else
        diskfile = fopen(filename, mode); 
#endif

        if (!(diskfile))           /* couldn't create file */
        {
            return(FILE_NOT_CREATED); 
        }
    }

    /* now create temporary memory file */

    /* initially allocate 1 FITS block = 2880 bytes */
    status = mem_createmem(2880L, handle);

    if (status)
    {
        ffpmsg("failed to create empty memory file (mem_create_comp)");
        return(status);
    }

    memTable[*handle].fileptr = diskfile;

    return(0);
}